

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O3

ON_StringMapOrdinalType ON_StringMapOrdinalTypeFromStringMapType(ON_StringMapType map_type)

{
  ON_StringMapType OVar1;
  
  OVar1 = Identity;
  if (map_type < (LowerCase|UpperCase)) {
    OVar1 = map_type;
  }
  return OVar1;
}

Assistant:

ON_StringMapOrdinalType ON_StringMapOrdinalTypeFromStringMapType(
  ON_StringMapType map_type
  )
{
  switch (map_type)
  {
  case ON_StringMapType::UpperCase:
    return ON_StringMapOrdinalType::UpperOrdinal;
  case ON_StringMapType::LowerCase:
    return ON_StringMapOrdinalType::LowerOrdinal;
  case ON_StringMapType::Identity:
    return ON_StringMapOrdinalType::Identity;
  }
  return ON_StringMapOrdinalType::Identity;
}